

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O3

void SparseKeygenRecurse<Blob<1536>,unsigned_int>
               (pfHash hash,int start,int bitsleft,bool inclusive,Blob<1536> *k,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *hashes)

{
  uint32_t start_00;
  iterator __position;
  undefined4 in_register_00000014;
  uint h;
  uint local_44;
  pfHash local_40;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_00000014,bitsleft);
  if (start < 0x600) {
    local_40 = hash;
    do {
      flipbit(k,0xc0,start);
      if (bitsleft == 1 || inclusive) {
        (*local_40)(k,0xc0,0,&local_44);
        __position._M_current =
             (hashes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (hashes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)hashes,__position,
                     &local_44);
        }
        else {
          *__position._M_current = local_44;
          (hashes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      start_00 = start + 1;
      if (1 < (int)local_38) {
        SparseKeygenRecurse<Blob<1536>,unsigned_int>
                  (local_40,start_00,bitsleft + -1,inclusive,k,hashes);
      }
      flipbit(k,0xc0,start);
      start = start_00;
    } while (start_00 != 0x600);
  }
  return;
}

Assistant:

void SparseKeygenRecurse ( pfHash hash, int start, int bitsleft, bool inclusive, keytype & k, std::vector<hashtype> & hashes )
{
  const int nbytes = sizeof(keytype);
  const int nbits = nbytes * 8;

  hashtype h;

  for(int i = start; i < nbits; i++)
  {
    flipbit(&k, nbytes, i);

    if(inclusive || (bitsleft == 1))
    {
      hash(&k, sizeof(keytype), 0, &h);
      hashes.push_back(h);
    }

    if(bitsleft > 1)
    {
      SparseKeygenRecurse(hash, i+1, bitsleft-1, inclusive, k, hashes);
    }

    flipbit(&k, nbytes, i);
  }
}